

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> *
google::protobuf::internal::CheckNotNull<google::protobuf::ResultCallback<std::__cxx11::string*>>
          (char *param_1,int param_2,char *name,
          ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *val)

{
  LogMessage *other;
  LogFinisher local_6d [13];
  LogMessage local_60;
  ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *local_28;
  ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *val_local;
  char *name_local;
  char *pcStack_10;
  int param_1_local;
  char *param_0_local;
  
  local_28 = val;
  if (val == (ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              *)0x0) {
    val_local = (ResultCallback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                 *)name;
    name_local._4_4_ = param_2;
    pcStack_10 = param_1;
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/logging.h"
               ,0xa6);
    other = LogMessage::operator<<(&local_60,(char *)val_local);
    LogFinisher::operator=(local_6d,other);
    LogMessage::~LogMessage(&local_60);
  }
  return local_28;
}

Assistant:

T* CheckNotNull(const char* /* file */, int /* line */,
                const char* name, T* val) {
  if (val == NULL) {
    GOOGLE_LOG(FATAL) << name;
  }
  return val;
}